

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_wav_ds_get_cursor(ma_data_source *pDataSource,ma_uint64 *pCursor)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pCursor != (ma_uint64 *)0x0) && (*pCursor = 0, pDataSource != (ma_data_source *)0x0)) {
    *pCursor = *(ma_uint64 *)((long)pDataSource + 0x108);
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

static ma_result ma_wav_ds_get_cursor(ma_data_source* pDataSource, ma_uint64* pCursor)
{
    return ma_wav_get_cursor_in_pcm_frames((ma_wav*)pDataSource, pCursor);
}